

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict * __thiscall
kj::ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>::operator=
          (ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *this,
          ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict *other
          )

{
  RemoveConst<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *pRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  pRVar1 = (RemoveConst<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry> *)other->pos;
  this->ptr = (Entry *)other->ptr;
  this->pos = pRVar1;
  pAVar2 = other->disposer;
  this->endPtr = (Entry *)other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (Entry *)0x0;
  other->pos = (RemoveConst<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict *
               )0x0;
  other->endPtr = (Entry *)0x0;
  return (ArrayBuilder<kj::HashMap<capnp::ClientHook_*,_capnp::ClientHook_*>::Entry>_conflict *)this
  ;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }